

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAtomicCounterTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::atomic_binding_omitted
               (NegativeTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Atomic counters must specify a binding point",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  iterateShaders(local_10,TESTCASE_LAYOUT_BINDING_OMITTED);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void atomic_binding_omitted (NegativeTestContext& ctx)
{
	ctx.beginSection("Atomic counters must specify a binding point");
	iterateShaders(ctx, TESTCASE_LAYOUT_BINDING_OMITTED);
	ctx.endSection();
}